

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_silu_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_dup_tensor(ctx,a);
  pgVar1->op = GGML_OP_SILU_BACK;
  pgVar1->src[0] = a;
  pgVar1->src[1] = b;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_silu_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    struct ggml_tensor * result = ggml_dup_tensor(ctx, a);

    result->op     = GGML_OP_SILU_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}